

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::additive_expr(analysis *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  TYPE TVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar4;
  NodePtr ret;
  NodePtr tmp_ptr;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_in_ptr;
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_e8;
  undefined1 local_d8 [24];
  undefined1 local_c0 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  local_e8._M_ptr = (TreeNode *)0x0;
  local_e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  multiplicative_expr((analysis *)local_d8);
  TVar3 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  uVar2 = local_d8._8_8_;
  if (TVar3 == ADDOP) {
    token::getVal_abi_cxx11_
              ((string *)local_98,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_c0._24_4_ =
         token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    std::make_shared<dh::TreeNode,std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (int *)local_98);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_e8,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
    std::__cxx11::string::~string((string *)local_98);
    token::getVal_abi_cxx11_
              ((string *)(local_98 + 0x28),
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,(string *)(local_98 + 0x28));
    std::__cxx11::string::~string((string *)(local_98 + 0x28));
    local_98._0_4_ = 1;
    TreeNode::setNodeKind(local_e8._M_ptr,(int *)local_98);
    local_98._0_4_ = 5;
    TreeNode::setKind(local_e8._M_ptr,(int *)local_98);
    TreeNode::appendChild(local_e8._M_ptr,(NodePtr *)local_d8);
    local_98._32_8_ = this;
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_c0,&local_e8);
    while( true ) {
      multiplicative_expr((analysis *)local_98);
      std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_d8,
                 (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      TreeNode::appendChild((TreeNode *)local_c0._0_8_,(NodePtr *)local_d8);
      TVar3 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar3 != ADDOP) break;
      token::getVal_abi_cxx11_
                ((string *)local_98,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_c0._20_4_ =
           token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      std::make_shared<dh::TreeNode,std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c0 + 0x18),(int *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      token::getVal_abi_cxx11_
                (&local_50,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      match(in_RSI,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      local_98._0_4_ = 1;
      TreeNode::setNodeKind((TreeNode *)CONCAT44(local_c0._28_4_,local_c0._24_4_),(int *)local_98);
      local_98._0_4_ = 5;
      TreeNode::setKind((TreeNode *)CONCAT44(local_c0._28_4_,local_c0._24_4_),(int *)local_98);
      TreeNode::appendChild
                ((TreeNode *)CONCAT44(local_c0._28_4_,local_c0._24_4_),(NodePtr *)local_c0);
      std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_c0,
                 (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    }
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_e8,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
    _Var1._M_pi = local_e8._M_refcount._M_pi;
    local_e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)local_98._32_8_ = local_e8._M_ptr;
    (((shared_ptr<dh::symTab> *)(local_98._32_8_ + 8))->
    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)_Var1._M_pi
    ;
    local_e8._M_ptr = (TreeNode *)0x0;
    this = (analysis *)local_98._32_8_;
  }
  else {
    local_d8._8_8_ = (element_type *)0x0;
    this->layer_record = local_d8._0_4_;
    this->initFlag = (bool)local_d8[4];
    *(undefined3 *)&this->field_0x5 = local_d8._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar2;
    local_d8._0_8_ = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::additive_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in additive_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr = multiplicative_expr();

	if ( tmp->getType() == TYPE::ADDOP)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		match(tmp->getVal());

		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::AdditiveK);
		ret->appendChild(tmp_ptr);

		NodePtr tmp_cur_ptr = ret;
		while (1)
		{
			tmp_ptr = multiplicative_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);

			if ( tmp->getType() == TYPE::ADDOP)
			{
				NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
				match(tmp->getVal());
				tmp_in_ptr->setNodeKind(NodeKind::ExprK);
				tmp_in_ptr->setKind(ExprKind::AdditiveK);
				tmp_in_ptr->appendChild(tmp_cur_ptr);
				tmp_cur_ptr = tmp_in_ptr;
			} else 
			{
				ret = tmp_cur_ptr;
				break;
			}
		}

	} else 
	{
		return tmp_ptr;
	}

	return ret;
}